

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O2

void __thiscall
chrono::robosimian::RS_WheelDD::Initialize
          (RS_WheelDD *this,shared_ptr<chrono::ChBodyAuxRef> *chassis,ChVector<double> *xyz,
          ChVector<double> *rpy)

{
  long *plVar1;
  ChFrame<double> *this_00;
  shared_ptr<chrono::ChBodyAuxRef> *__r;
  shared_ptr<chrono::ChLinkLockRevolute> joint;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_1c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2> local_1b0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  ChCoordsys<double> local_1a0;
  __shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2> local_168 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  ChVector<double> local_158;
  ChFrame<double> X_GC;
  ChFrame<double> X_PC;
  
  this_00 = (ChFrame<double> *)
            (**(code **)(*(long *)(chassis->
                                  super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr + 0x1f0))();
  rpy2quat((ChQuaternion<double> *)&X_GC,rpy);
  ChFrame<double>::ChFrame(&X_PC,xyz,(ChQuaternion<double> *)&X_GC);
  ChFrame<double>::operator*(&X_GC,this_00,&X_PC);
  chrono::ChBodyAuxRef::SetFrame_REF_to_abs
            ((ChFrame *)
             (this->super_RS_Part).m_body.
             super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  RS_Part::AddCollisionShapes(&this->super_RS_Part);
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1a0,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((this->super_RS_Part).m_body.
              super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x198));
  (**(code **)(*(long *)local_1a0.pos.m_data[0] + 200))(local_1a0.pos.m_data[0],7);
  __r = &(this->super_RS_Part).m_body;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a0.pos.m_data + 1));
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1a0,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
             0x198));
  (**(code **)(*(long *)local_1a0.pos.m_data[0] + 0xd8))(local_1a0.pos.m_data[0],5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a0.pos.m_data + 1));
  std::__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             &local_1a0,
             (__shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2> *)
             ((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
             0x198));
  (**(code **)(*(long *)local_1a0.pos.m_data[0] + 0xd8))(local_1a0.pos.m_data[0],6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a0.pos.m_data + 1));
  chrono::ChBody::SetCollide
            (SUB81((__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,0));
  chrono_types::make_shared<chrono::ChLinkLockRevolute,_0>();
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_1b0,
             &chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBody,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBodyAuxRef,void>
            (local_1c0,&__r->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>);
  local_158.m_data[0] = 0.0;
  local_158.m_data[1] = 0.0;
  local_158.m_data[2] = 1.0;
  calcJointFrame(&local_1a0,&X_GC,&local_158);
  (**(code **)(*(long *)joint.
                        super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x250))
            (joint.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,local_1b0,local_1c0,&local_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1a8);
  plVar1 = *(long **)((chassis->super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr + 0x38);
  std::__shared_ptr<chrono::ChLinkBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChLinkLockRevolute,void>
            (local_168,
             &joint.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*plVar1 + 0x138))(plVar1,local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&joint.super___shared_ptr<chrono::ChLinkLockRevolute,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void RS_WheelDD::Initialize(std::shared_ptr<ChBodyAuxRef> chassis, const ChVector<>& xyz, const ChVector<>& rpy) {
    const ChFrame<>& X_GP = chassis->GetFrame_REF_to_abs();  // global -> parent
    ChFrame<> X_PC(xyz, rpy2quat(rpy));                      // parent -> child
    ChFrame<> X_GC = X_GP * X_PC;                            // global -> child
    m_body->SetFrame_REF_to_abs(X_GC);

    AddCollisionShapes();

    m_body->GetCollisionModel()->SetFamily(CollisionFamily::WHEEL_DD);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::CHASSIS);
    m_body->GetCollisionModel()->SetFamilyMaskNoCollisionWithFamily(CollisionFamily::SLED);

    // Note: call this AFTER setting the collision family (required for Chrono::Multicore)
    m_body->SetCollide(true);

    // Add joint
    auto joint = chrono_types::make_shared<ChLinkLockRevolute>();
    joint->Initialize(chassis, m_body, calcJointFrame(X_GC, ChVector<>(0, 0, 1)));
    chassis->GetSystem()->AddLink(joint);
}